

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O3

void itis::SplayTree::zig(Node *x)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = x->parent;
  if (pNVar1->left_child == x) {
    pNVar2 = x->right_child;
    x->parent = (Node *)0x0;
    x->right_child = pNVar1;
    pNVar1->parent = x;
    pNVar1->left_child = pNVar2;
  }
  else {
    pNVar2 = x->left_child;
    x->parent = (Node *)0x0;
    x->left_child = pNVar1;
    pNVar1->parent = x;
    pNVar1->right_child = pNVar2;
  }
  if (pNVar2 != (Node *)0x0) {
    pNVar2->parent = pNVar1;
  }
  return;
}

Assistant:

void SplayTree::zig(Node *x) {
    Node *parent_node = x->parent;

    if (parent_node->left_child == x) {
      Node *A = x->right_child;

      x->parent = nullptr;
      x->right_child = parent_node;

      parent_node->parent = x;
      parent_node->left_child = A;

      if (A != nullptr) {
        A->parent = parent_node;
      }
    } else {
      Node *A = x->left_child;

      x->parent = nullptr;
      x->left_child = parent_node;

      parent_node->parent = x;
      parent_node->right_child = A;

      if (A != nullptr) {
        A->parent = parent_node;
      }
    }
  }